

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSliderConstraint.cpp
# Opt level: O0

void __thiscall btSliderConstraint::testAngLimits(btSliderConstraint *this)

{
  long in_RDI;
  btTransform *this_00;
  btScalar bVar1;
  btScalar rot;
  btVector3 axisB0;
  btVector3 axisA1;
  btVector3 axisA0;
  btScalar in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  btVector3 local_38;
  btVector3 local_28;
  btVector3 local_18;
  
  *(undefined4 *)(in_RDI + 0x458) = 0;
  *(undefined1 *)(in_RDI + 0x141) = 0;
  if (*(float *)(in_RDI + 0xd8) <= *(float *)(in_RDI + 0xdc)) {
    this_00 = (btTransform *)(in_RDI + 0x350);
    btTransform::getBasis(this_00);
    local_18 = btMatrix3x3::getColumn
                         ((btMatrix3x3 *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          (int)((ulong)in_RDI >> 0x20));
    btTransform::getBasis(this_00);
    local_28 = btMatrix3x3::getColumn
                         ((btMatrix3x3 *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          (int)((ulong)in_RDI >> 0x20));
    btTransform::getBasis((btTransform *)(in_RDI + 0x390));
    local_38 = btMatrix3x3::getColumn
                         ((btMatrix3x3 *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          (int)((ulong)in_RDI >> 0x20));
    btVector3::dot(&local_38,&local_28);
    btVector3::dot(&local_38,&local_18);
    btAtan2(0.0,3.128524e-39);
    bVar1 = btAdjustAngleToLimits
                      (in_stack_ffffffffffffffc0,(btScalar)((ulong)in_RDI >> 0x20),(btScalar)in_RDI)
    ;
    *(btScalar *)(in_RDI + 0x454) = bVar1;
    if (*(float *)(in_RDI + 0xd8) <= bVar1) {
      if (*(float *)(in_RDI + 0xdc) <= bVar1 && bVar1 != *(float *)(in_RDI + 0xdc)) {
        *(float *)(in_RDI + 0x458) = bVar1 - *(float *)(in_RDI + 0xdc);
        *(undefined1 *)(in_RDI + 0x141) = 1;
      }
    }
    else {
      *(float *)(in_RDI + 0x458) = bVar1 - *(float *)(in_RDI + 0xd8);
      *(undefined1 *)(in_RDI + 0x141) = 1;
    }
  }
  return;
}

Assistant:

void btSliderConstraint::testAngLimits(void)
{
	m_angDepth = btScalar(0.);
	m_solveAngLim = false;
	if(m_lowerAngLimit <= m_upperAngLimit)
	{
		const btVector3 axisA0 = m_calculatedTransformA.getBasis().getColumn(1);
		const btVector3 axisA1 = m_calculatedTransformA.getBasis().getColumn(2);
		const btVector3 axisB0 = m_calculatedTransformB.getBasis().getColumn(1);
//		btScalar rot = btAtan2Fast(axisB0.dot(axisA1), axisB0.dot(axisA0));  
		btScalar rot = btAtan2(axisB0.dot(axisA1), axisB0.dot(axisA0));  
		rot = btAdjustAngleToLimits(rot, m_lowerAngLimit, m_upperAngLimit);
		m_angPos = rot;
		if(rot < m_lowerAngLimit)
		{
			m_angDepth = rot - m_lowerAngLimit;
			m_solveAngLim = true;
		} 
		else if(rot > m_upperAngLimit)
		{
			m_angDepth = rot - m_upperAngLimit;
			m_solveAngLim = true;
		}
	}
}